

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte.cpp
# Opt level: O1

int __thiscall merlin::cte::init(cte *this,EVP_PKEY_CTX *ctx)

{
  variable_order_t *order;
  double dVar1;
  pointer pmVar2;
  pointer pmVar3;
  pointer ppeVar4;
  edge *peVar5;
  pointer pfVar6;
  pointer pmVar7;
  pointer pmVar8;
  int extraout_EAX;
  ostream *poVar9;
  pointer puVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  pointer pfVar15;
  long lVar16;
  pointer pfVar17;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> fin;
  vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  clusters;
  variable_set scope;
  graph g;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> local_1a8;
  double local_188;
  vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  local_180;
  factor local_168;
  graph local_108;
  
  if (0 < this->m_verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[CTE] + inference task   : ",0x1b);
    poVar9 = operator<<((ostream *)&std::cout,&this->m_task);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  if ((this->m_query).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->m_query).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (0 < this->m_verbose) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[CTE] + query vars       : ",0x1b);
      puVar10 = (this->m_query).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_108.m_adj.
      super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&std::cout;
      local_108.m_adj.
      super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1761de;
      lVar16 = (long)(this->m_query).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar10 >> 3;
      if (0 < lVar16) {
        lVar16 = lVar16 + 1;
        do {
          std::ostream_iterator<unsigned_long,_char,_std::char_traits<char>_>::operator=
                    ((ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> *)&local_108,
                     puVar10);
          puVar10 = puVar10 + 1;
          lVar16 = lVar16 + -1;
        } while (1 < lVar16);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
      std::ostream::put('@');
      std::ostream::flush();
    }
    if ((ulong)((long)(this->m_query).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->m_query).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start) < 0x30) {
      local_168.v_.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_168.v_.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_168.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_168._vptr_factor = (_func_int **)0x0;
      local_168.v_.m_v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_168.v_.m_dlocal.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar10 = (this->m_query).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((this->m_query).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar10) {
        uVar14 = 0;
        do {
          local_108.m_adj.
          super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar10[uVar14];
          dVar1 = (this->m_gmo).m_dims.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start
                  [(long)local_108.m_adj.
                         super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
                         ._M_impl.super__Vector_impl_data._M_start];
          uVar11 = (ulong)dVar1;
          local_108.m_adj.
          super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)((long)(dVar1 - 9.223372036854776e+18) & (long)uVar11 >> 0x3f | uVar11);
          variable_set::operator|=((variable_set *)&local_168,(variable *)&local_108);
          uVar14 = uVar14 + 1;
          puVar10 = (this->m_query).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar14 < (ulong)((long)(this->m_query).
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar10
                                 >> 3));
      }
      factor::factor((factor *)&local_108,(variable_set *)&local_168,1.0);
      graphical_model::add_factor(&this->m_gmo,(factor *)&local_108);
      factor::~factor((factor *)&local_108);
      variable_set::~variable_set((variable_set *)&local_168);
    }
  }
  if ((this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    graphical_model::order
              ((variable_order_t *)&local_108,&this->m_gmo,(OrderMethod)(this->m_order_method).t_);
    puVar10 = (this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    (this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)local_108.m_adj.
                  super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    (this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)local_108.m_adj.
                  super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    (this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)local_108.m_adj.
                  super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_108.m_adj.
    super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.m_adj.
    super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.m_adj.
    super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar10 != (pointer)0x0) {
      operator_delete(puVar10);
    }
    if (local_108.m_adj.
        super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.m_adj.
                      super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  order = &this->m_order;
  if (0 < this->m_verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[CTE] + ordering method  : ",0x1b);
    poVar9 = operator<<((ostream *)&std::cout,&this->m_order_method);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[CTE] + elimination      : ",0x1b);
    puVar10 = (this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_108.m_adj.
    super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)&std::cout;
    local_108.m_adj.
    super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1761de;
    lVar16 = (long)(this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar10 >> 3;
    if (0 < lVar16) {
      lVar16 = lVar16 + 1;
      do {
        std::ostream_iterator<unsigned_long,_char,_std::char_traits<char>_>::operator=
                  ((ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> *)&local_108,
                   puVar10);
        puVar10 = puVar10 + 1;
        lVar16 = lVar16 + -1;
      } while (1 < lVar16);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    graphical_model::induced_width(&this->m_gmo,order);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[CTE] + induced width    : ",0x1b);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[CTE] + exact inference  : Yes",0x1e);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[CTE] + ordering time    : ",0x1b);
    gettimeofday((timeval *)&local_108,(__timezone_ptr_t)0x0);
    poVar9 = std::ostream::_M_insert<double>
                       (((double)(long)local_108.m_adj.
                                       super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish / 1000000.0 +
                        (double)(long)local_108.m_adj.
                                      super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) -
                        (this->super_algorithm).m_start_time);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," seconds",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[CTE] Building clique tree ... ",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
  }
  pmVar2 = (this->m_gmo).super_graph.m_adj.
           super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pmVar3 = (this->m_gmo).super_graph.m_adj.
           super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1a8.super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pfVar17 = (this->m_gmo).m_factors.
            super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pfVar17 !=
      (this->m_gmo).m_factors.super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::push_back
                (&local_1a8,&pfVar17->v_);
      pfVar17 = pfVar17 + 1;
    } while (pfVar17 !=
             (this->m_gmo).m_factors.
             super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  graph::graph(&local_108,(long)pmVar2 - (long)pmVar3 >> 5);
  graph::init(&local_108,(EVP_PKEY_CTX *)&local_1a8);
  graph::triangulate(&local_108,order);
  graph::maximal_cliques(&local_180,&local_108,order);
  build_clique_tree(this,&local_180);
  if (0 < this->m_verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[CTE] Created clique tree with ",0x1f);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," clique factors",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  ppeVar4 = (this->m_edges).
            super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar16 = (long)(this->m_edges).
                 super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppeVar4;
  if (lVar16 != 0) {
    lVar16 = lVar16 >> 3;
    lVar12 = 0;
    uVar14 = 0;
    uVar11 = 0;
    do {
      peVar5 = ppeVar4[lVar12];
      uVar13 = (long)(peVar5->first->clique).m_v.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               *(long *)&(peVar5->first->clique).m_v.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
               >> 3;
      if (uVar13 < uVar14) {
        uVar13 = uVar14;
      }
      uVar14 = (long)(peVar5->second->clique).m_v.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               *(long *)&(peVar5->second->clique).m_v.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
               >> 3;
      if (uVar14 < uVar13) {
        uVar14 = uVar13;
      }
      uVar13 = (long)(peVar5->sepset).m_v.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               *(long *)&(peVar5->sepset).m_v.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> >> 3;
      if (uVar13 < uVar11) {
        uVar13 = uVar11;
      }
      uVar11 = uVar13;
      lVar12 = lVar12 + 1;
    } while (lVar16 + (ulong)(lVar16 == 0) != lVar12);
  }
  this->m_logz = 0.0;
  pfVar17 = (this->m_beliefs).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pfVar6 = (this->m_beliefs).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pfVar15 = pfVar17;
  if (pfVar6 != pfVar17) {
    do {
      (**pfVar15->_vptr_factor)(pfVar15);
      pfVar15 = pfVar15 + 1;
    } while (pfVar15 != pfVar6);
    (this->m_beliefs).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar17;
  }
  pmVar7 = (this->m_gmo).m_vadj.
           super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pmVar8 = (this->m_gmo).m_vadj.
           super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  factor::factor(&local_168,1.0);
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::resize
            (&this->m_beliefs,(long)pmVar8 - (long)pmVar7 >> 5,&local_168);
  factor::~factor(&local_168);
  if (0 < this->m_verbose) {
    gettimeofday((timeval *)&local_168,(__timezone_ptr_t)0x0);
    local_188 = ((double)(long)local_168.v_.m_v.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start / 1000000.0 +
                (double)(long)local_168._vptr_factor) - (this->super_algorithm).m_start_time;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[CTE] Number of cliques  : ",0x1b);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[CTE] Number of edges    : ",0x1b);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[CTE] Max clique size    : ",0x1b);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[CTE] Max separator size : ",0x1b);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[CTE] Finished initialization in ",0x21);
    poVar9 = std::ostream::_M_insert<double>(local_188);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," seconds",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  std::
  vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_180);
  graph::~graph(&local_108);
  std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::~vector(&local_1a8);
  return extraout_EAX;
}

Assistant:

void cte::init() {

	// Prologue
	if (m_verbose > 0) {
		std::cout << "[CTE] + inference task   : " << m_task << std::endl;
	}

	if (m_query.empty() == false) {
		if (m_verbose > 0) {
			std::cout << "[CTE] + query vars       : ";
			std::copy(m_query.begin(), m_query.end(), std::ostream_iterator<vindex>(std::cout, " "));
			std::cout << std::endl;
		}

		// Add a dummy factor over the query variables
		if (m_query.size() <= MERLIN_MAXSIZE_JOINT_MARGINAL) {
			variable_set scope;
			for (size_t i = 0; i < m_query.size(); ++i) {
				scope |= m_gmo.var(m_query[i]);
			}

			factor q(scope, 1.0);
			m_gmo.add_factor(q);
		}
	}

	if (m_order.size() == 0) { // if we need to construct an elimination ordering
		m_order = m_gmo.order(m_order_method);
	}


	if (m_verbose > 0) {
		std::cout << "[CTE] + ordering method  : " << m_order_method << std::endl;
		std::cout << "[CTE] + elimination      : ";
		std::copy(m_order.begin(), m_order.end(),
				std::ostream_iterator<size_t>(std::cout, " "));
		std::cout << std::endl;

		// Calculate the induced width of the elimination ordering
		size_t wstar = m_gmo.induced_width(m_order);
		std::cout << "[CTE] + induced width    : " << wstar << std::endl;
		std::cout << "[CTE] + exact inference  : Yes" << std::endl;
		std::cout << "[CTE] + ordering time    : " << (timeSystem() - m_start_time) << " seconds" << std::endl;
		std::cout << "[CTE] Building clique tree ... " << std::endl;
	}

	// Get the factors scopes
	size_t n = m_gmo.num_nodes();
	std::vector<variable_set> fin;
	for (std::vector<factor>::const_iterator i = m_gmo.get_factors().begin();
			i != m_gmo.get_factors().end(); ++i) {
		fin.push_back((*i).vars());
	}

	// Create the graph
	graph g(n);
	g.init(fin);

	// Triangulate the graph
	g.triangulate(m_order);

	// Find the maximal cliques
	std::vector<std::set<size_t> > clusters = g.maximal_cliques(m_order);

	// Build the clique tree
	build_clique_tree(clusters);

	if (m_verbose > 0) {
		std::cout << "[CTE] Created clique tree with " << m_clusters.size()
				<< " clique factors" << std::endl;
	}

	size_t max_clique_size = 0, max_sepset_size = 0;
	for (size_t i = 0; i < m_edges.size(); ++i) {
		detail::edge* e = m_edges[i];
		max_clique_size = std::max(max_clique_size, e->first->clique.size());
		max_clique_size = std::max(max_clique_size, e->second->clique.size());
		max_sepset_size = std::max(max_sepset_size, e->sepset.size());
	}

	// Initialize beliefs (marginals)
	m_logz = 0;
	m_beliefs.clear();
	m_beliefs.resize(m_gmo.nvar(), factor(1.0));

	// Output the bucket tree statistics
	if (m_verbose > 0) {
		double elapsed = (timeSystem() - m_start_time);
		std::cout << "[CTE] Number of cliques  : " << m_clusters.size() << std::endl;
		std::cout << "[CTE] Number of edges    : " << m_edges.size() << std::endl;
		std::cout << "[CTE] Max clique size    : " << max_clique_size << std::endl;
		std::cout << "[CTE] Max separator size : " << max_sepset_size << std::endl;
		std::cout << "[CTE] Finished initialization in " << elapsed << " seconds" << std::endl;
	}
}